

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearfit.cpp
# Opt level: O3

void __thiscall GoodNess::calcGoodNess(GoodNess *this,double *x,double *y,int count)

{
  double dVar1;
  ulong uVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar4 = 0.0;
  dVar5 = 0.0;
  if (0 < count) {
    dVar3 = 0.0;
    uVar2 = 0;
    do {
      dVar3 = dVar3 + y[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)count != uVar2);
    if (0 < count) {
      dVar4 = 0.0;
      dVar5 = 0.0;
      uVar2 = 0;
      do {
        (**this->_vptr_GoodNess)(x[uVar2],this);
        dVar1 = y[uVar2];
        (**this->_vptr_GoodNess)(x[uVar2],this);
        dVar6 = extraout_XMM0_Qa - dVar3 / (double)count;
        dVar4 = dVar4 + (dVar1 - extraout_XMM0_Qa_00) * (dVar1 - extraout_XMM0_Qa_00);
        dVar5 = dVar5 + dVar6 * dVar6;
        uVar2 = uVar2 + 1;
      } while ((uint)count != uVar2);
    }
  }
  this->goodness = (double)(~-(ulong)(dVar4 + dVar5 == 0.0) & (ulong)(dVar5 / (dVar4 + dVar5)));
  return;
}

Assistant:

void GoodNess::calcGoodNess(double *x, double *y, int count)
{
    double sum0 = 0.0,dy=0.0;
    double ESS = 0.0; // �ع�ƽ����
    double RSS = 0.0; // �в�ƽ����
    double TSS = 0.0; // ����ƽ����
	int i = 0;

    for(i=0;i<count;i++)
        sum0 += y[i];
    dy = sum0/count;

    for(i=0;i<count;i++)
    {
        ESS += pow(func(x[i]) - dy, 2);
        RSS += pow(y[i] - func(x[i]) ,2);
    }
    TSS = ESS + RSS;
    if(TSS == 0.0)
        goodness = 0.0;
    else
        goodness = ESS / TSS ;
}